

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

void __thiscall ft::list<int,_ft::allocator<int>_>::reverse(list<int,_ft::allocator<int>_> *this)

{
  listNode<int> *plVar1;
  node *pnVar2;
  listNode<int> *plVar3;
  listNode<int> *plVar4;
  
  if (1 < this->m_size) {
    plVar3 = this->m_tail;
    plVar4 = this->m_head->next;
    if (plVar4 != plVar3) {
      do {
        plVar3 = plVar4->prev;
        plVar1 = plVar4->next;
        plVar4->prev = plVar1;
        plVar4->next = plVar3;
        plVar3 = this->m_tail;
        plVar4 = plVar1;
      } while (plVar1 != plVar3);
    }
    pnVar2 = this->m_head;
    this->m_head = plVar3;
    this->m_tail = pnVar2;
    plVar4 = plVar3->prev;
    plVar3->prev = plVar3->next;
    plVar3->next = plVar4;
    pnVar2 = this->m_tail;
    plVar3 = pnVar2->prev;
    pnVar2->prev = pnVar2->next;
    pnVar2->next = plVar3;
  }
  return;
}

Assistant:

void reverse() {
		if (this->size() > 1) {
			for (iterator it = this->begin(); it != this->end(); --it)
				ft::swap(it.node()->prev, it.node()->next);
			ft::swap(this->m_head, this->m_tail);
			ft::swap(this->head()->prev, this->head()->next);
			ft::swap(this->tail()->prev, this->tail()->next);
		}
	}